

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void wasm::PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::scan
               (InitScanner *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  Resume *pRVar2;
  StackSwitch *pSVar3;
  Expression **ppEVar4;
  StructSet *pSVar5;
  ContBind *pCVar6;
  RefI31 *pRVar7;
  CallRef *pCVar8;
  RefAs *pRVar9;
  Call *pCVar10;
  MemoryInit *pMVar11;
  CallIndirect *pCVar12;
  Load *pLVar13;
  Try *pTVar14;
  Switch *pSVar15;
  ArrayNew *pAVar16;
  Return *pRVar17;
  StructNew *pSVar18;
  BrOn *pBVar19;
  Suspend *pSVar20;
  Store *pSVar21;
  Throw *pTVar22;
  ArraySet *pAVar23;
  ResumeThrow *pRVar24;
  TupleMake *pTVar25;
  StringNew *pSVar26;
  ArrayNewFixed *pAVar27;
  Expression **currp_00;
  Expression **currp_01;
  Expression **extraout_RDX;
  Expression **currp_02;
  Expression **extraout_RDX_00;
  Expression **extraout_RDX_01;
  Expression **extraout_RDX_02;
  Expression **currp_03;
  Expression **currp_04;
  ulong uVar28;
  Break *pBVar29;
  TableGet *pTVar30;
  
  this = *currp;
  switch(this->_id) {
  case InvalidId:
  case NumExpressionIds:
    wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
               ,0x103);
  case BlockId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitBlock,currp);
    pBVar1 = Expression::cast<wasm::Block>(this);
    uVar28 = (ulong)(uint)(pBVar1->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pBVar1->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar28);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case IfId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitIf,currp);
    pAVar23 = (ArraySet *)Expression::cast<wasm::If>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::maybePushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               (TaskFunc)&pAVar23->value,currp_02);
    goto LAB_0014b6a0;
  case LoopId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitLoop,currp);
    pTVar30 = (TableGet *)Expression::cast<wasm::Loop>(this);
    goto LAB_0014b279;
  case BreakId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitBreak,currp);
    pBVar29 = Expression::cast<wasm::Break>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::maybePushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               (TaskFunc)(pBVar29 + 0x28),currp_01);
    pBVar29 = pBVar29 + 0x20;
    ppEVar4 = extraout_RDX;
    goto LAB_0014b173;
  case SwitchId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSwitch,currp);
    pSVar15 = Expression::cast<wasm::Switch>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar15 + 0x48));
    pBVar29 = (Break *)(pSVar15 + 0x40);
    ppEVar4 = extraout_RDX_00;
    goto LAB_0014b173;
  case CallId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitCall,currp);
    pCVar10 = Expression::cast<wasm::Call>(this);
    uVar28 = (ulong)(uint)(pCVar10->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar10->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar28);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case CallIndirectId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitCallIndirect,currp);
    pCVar12 = Expression::cast<wasm::CallIndirect>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pCVar12 + 0x38));
    uVar28 = (ulong)*(uint *)(pCVar12 + 0x20);
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar12 + 0x18),uVar28);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case LocalGetId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitLocalGet,currp);
    Expression::cast<wasm::LocalGet>(this);
    return;
  case LocalSetId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitLocalSet,currp);
    pRVar9 = (RefAs *)Expression::cast<wasm::LocalSet>(this);
    goto LAB_0014b4d1;
  case GlobalGetId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitGlobalGet,currp);
    Expression::cast<wasm::GlobalGet>(this);
    return;
  case GlobalSetId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitGlobalSet,currp);
    pTVar30 = (TableGet *)Expression::cast<wasm::GlobalSet>(this);
    goto LAB_0014b279;
  case LoadId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitLoad,currp);
    pLVar13 = Expression::cast<wasm::Load>(this);
    pTVar30 = (TableGet *)&pLVar13->ptr;
    goto LAB_0014b6b8;
  case StoreId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStore,currp);
    pSVar21 = Expression::cast<wasm::Store>(this);
    goto LAB_0014b498;
  case ConstId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitConst,currp);
    Expression::cast<wasm::Const>(this);
    return;
  case UnaryId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitUnary,currp);
    pRVar9 = (RefAs *)Expression::cast<wasm::Unary>(this);
    goto LAB_0014b4d1;
  case BinaryId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitBinary,currp);
    pSVar5 = (StructSet *)Expression::cast<wasm::Binary>(this);
    goto LAB_0014b43a;
  case SelectId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSelect,currp);
    pAVar23 = (ArraySet *)Expression::cast<wasm::Select>(this);
    goto LAB_0014b691;
  case DropId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitDrop,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::Drop>(this);
    goto LAB_0014b30a;
  case ReturnId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitReturn,currp);
    pRVar17 = Expression::cast<wasm::Return>(this);
    pBVar29 = (Break *)(pRVar17 + 0x10);
    ppEVar4 = extraout_RDX_02;
    goto LAB_0014b173;
  case MemorySizeId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitMemorySize,currp);
    Expression::cast<wasm::MemorySize>(this);
    return;
  case MemoryGrowId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitMemoryGrow,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::MemoryGrow>(this);
    goto LAB_0014b30a;
  case NopId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitNop,currp);
    Expression::cast<wasm::Nop>(this);
    return;
  case UnreachableId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitUnreachable,currp);
    Expression::cast<wasm::Unreachable>(this);
    return;
  case AtomicRMWId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitAtomicRMW,currp);
    pMVar11 = (MemoryInit *)Expression::cast<wasm::AtomicRMW>(this);
    goto LAB_0014b518;
  case AtomicCmpxchgId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitAtomicCmpxchg,currp);
    pMVar11 = (MemoryInit *)Expression::cast<wasm::AtomicCmpxchg>(this);
    goto LAB_0014b509;
  case AtomicWaitId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitAtomicWait,currp);
    pSVar5 = (StructSet *)Expression::cast<wasm::AtomicWait>(this);
    goto LAB_0014b299;
  case AtomicNotifyId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitAtomicNotify,currp);
    pSVar5 = (StructSet *)Expression::cast<wasm::AtomicNotify>(this);
    goto LAB_0014b43a;
  case AtomicFenceId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitAtomicFence,currp);
    Expression::cast<wasm::AtomicFence>(this);
    return;
  case SIMDExtractId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSIMDExtract,currp);
    pRVar9 = (RefAs *)Expression::cast<wasm::SIMDExtract>(this);
    goto LAB_0014b4d1;
  case SIMDReplaceId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSIMDReplace,currp);
    pSVar5 = (StructSet *)Expression::cast<wasm::SIMDReplace>(this);
    ppEVar4 = (Expression **)&pSVar5->order;
    goto LAB_0014b448;
  case SIMDShuffleId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSIMDShuffle,currp);
    pAVar23 = (ArraySet *)Expression::cast<wasm::SIMDShuffle>(this);
    goto LAB_0014b6a0;
  case SIMDTernaryId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSIMDTernary,currp);
    pSVar5 = (StructSet *)Expression::cast<wasm::SIMDTernary>(this);
    goto LAB_0014b299;
  case SIMDShiftId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSIMDShift,currp);
    pSVar5 = (StructSet *)Expression::cast<wasm::SIMDShift>(this);
    goto LAB_0014b43a;
  case SIMDLoadId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSIMDLoad,currp);
    pBVar19 = (BrOn *)Expression::cast<wasm::SIMDLoad>(this);
    goto LAB_0014b3d4;
  case SIMDLoadStoreLaneId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSIMDLoadStoreLane,
               currp);
    pSVar21 = (Store *)Expression::cast<wasm::SIMDLoadStoreLane>(this);
LAB_0014b498:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,&pSVar21->value);
    pTVar30 = (TableGet *)&pSVar21->ptr;
    goto LAB_0014b6b8;
  case MemoryInitId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitMemoryInit,currp);
    pMVar11 = Expression::cast<wasm::MemoryInit>(this);
    goto LAB_0014b509;
  case DataDropId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitDataDrop,currp);
    Expression::cast<wasm::DataDrop>(this);
    return;
  case MemoryCopyId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitMemoryCopy,currp);
    pAVar23 = (ArraySet *)Expression::cast<wasm::MemoryCopy>(this);
    goto LAB_0014b691;
  case MemoryFillId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitMemoryFill,currp);
    pAVar23 = (ArraySet *)Expression::cast<wasm::MemoryFill>(this);
    goto LAB_0014b691;
  case PopId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitPop,currp);
    Expression::cast<wasm::Pop>(this);
    return;
  case RefNullId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefNull,currp);
    Expression::cast<wasm::RefNull>(this);
    return;
  case RefIsNullId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefIsNull,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::RefIsNull>(this);
    goto LAB_0014b30a;
  case RefFuncId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefFunc,currp);
    Expression::cast<wasm::RefFunc>(this);
    return;
  case RefEqId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefEq,currp);
    pAVar23 = (ArraySet *)Expression::cast<wasm::RefEq>(this);
    goto LAB_0014b6a0;
  case TableGetId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTableGet,currp);
    pTVar30 = Expression::cast<wasm::TableGet>(this);
LAB_0014b279:
    pTVar30 = pTVar30 + 0x20;
    goto LAB_0014b6b8;
  case TableSetId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTableSet,currp);
    pMVar11 = (MemoryInit *)Expression::cast<wasm::TableSet>(this);
    goto LAB_0014b518;
  case TableSizeId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTableSize,currp);
    Expression::cast<wasm::TableSize>(this);
    return;
  case TableGrowId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTableGrow,currp);
    pMVar11 = (MemoryInit *)Expression::cast<wasm::TableGrow>(this);
    goto LAB_0014b518;
  case TableFillId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTableFill,currp);
    pMVar11 = (MemoryInit *)Expression::cast<wasm::TableFill>(this);
    goto LAB_0014b509;
  case TableCopyId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTableCopy,currp);
    pAVar23 = (ArraySet *)Expression::cast<wasm::TableCopy>(this);
    goto LAB_0014b691;
  case TableInitId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTableInit,currp);
    pMVar11 = (MemoryInit *)Expression::cast<wasm::TableInit>(this);
    goto LAB_0014b509;
  case TryId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTry,currp);
    pTVar14 = Expression::cast<wasm::Try>(this);
    uVar28 = (ulong)*(uint *)(pTVar14 + 0x50);
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pTVar14 + 0x48),uVar28);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar4);
    }
    pTVar30 = (TableGet *)(pTVar14 + 0x20);
    goto LAB_0014b6b8;
  case TryTableId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTryTable,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::TryTable>(this);
    goto LAB_0014b30a;
  case ThrowId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitThrow,currp);
    pTVar22 = Expression::cast<wasm::Throw>(this);
    uVar28 = (ulong)*(uint *)(pTVar22 + 0x28);
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pTVar22 + 0x20),uVar28);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case RethrowId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRethrow,currp);
    Expression::cast<wasm::Rethrow>(this);
    return;
  case ThrowRefId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitThrowRef,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::ThrowRef>(this);
    goto LAB_0014b30a;
  case TupleMakeId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTupleMake,currp);
    pTVar25 = Expression::cast<wasm::TupleMake>(this);
    uVar28 = (ulong)(uint)(pTVar25->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar25->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar28);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case TupleExtractId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitTupleExtract,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::TupleExtract>(this);
    goto LAB_0014b30a;
  case RefI31Id:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefI31,currp);
    pRVar7 = Expression::cast<wasm::RefI31>(this);
    goto LAB_0014b30a;
  case I31GetId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitI31Get,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::I31Get>(this);
    goto LAB_0014b30a;
  case CallRefId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitCallRef,currp);
    pCVar8 = Expression::cast<wasm::CallRef>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pCVar8 + 0x30));
    uVar28 = (ulong)*(uint *)(pCVar8 + 0x18);
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar8 + 0x10),uVar28);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case RefTestId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefTest,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::RefTest>(this);
    goto LAB_0014b30a;
  case RefCastId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefCast,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::RefCast>(this);
    goto LAB_0014b30a;
  case BrOnId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitBrOn,currp);
    pBVar19 = Expression::cast<wasm::BrOn>(this);
LAB_0014b3d4:
    pTVar30 = (TableGet *)(pBVar19 + 0x28);
    goto LAB_0014b6b8;
  case StructNewId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStructNew,currp);
    pSVar18 = Expression::cast<wasm::StructNew>(this);
    uVar28 = (ulong)(uint)(pSVar18->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar18->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar28);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case StructGetId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStructGet,currp);
    pRVar9 = (RefAs *)Expression::cast<wasm::StructGet>(this);
    goto LAB_0014b4d1;
  case StructSetId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStructSet,currp);
    pSVar5 = Expression::cast<wasm::StructSet>(this);
    goto LAB_0014b43a;
  case StructRMWId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStructRMW,currp);
    pSVar5 = (StructSet *)Expression::cast<wasm::StructRMW>(this);
    goto LAB_0014b43a;
  case StructCmpxchgId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStructCmpxchg,currp);
    pSVar5 = (StructSet *)Expression::cast<wasm::StructCmpxchg>(this);
LAB_0014b299:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)&pSVar5->order);
    ppEVar4 = &pSVar5->value;
    goto LAB_0014b448;
  case ArrayNewId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayNew,currp);
    pAVar16 = Expression::cast<wasm::ArrayNew>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar16 + 0x18));
    pBVar29 = (Break *)(pAVar16 + 0x10);
    ppEVar4 = extraout_RDX_01;
LAB_0014b173:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::maybePushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,(TaskFunc)pBVar29,
               ppEVar4);
    return;
  case ArrayNewDataId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayNewData,currp);
    pMVar11 = (MemoryInit *)Expression::cast<wasm::ArrayNewData>(this);
    goto LAB_0014b518;
  case ArrayNewElemId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayNewElem,currp);
    pMVar11 = (MemoryInit *)Expression::cast<wasm::ArrayNewElem>(this);
    goto LAB_0014b518;
  case ArrayNewFixedId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayNewFixed,currp);
    pAVar27 = Expression::cast<wasm::ArrayNewFixed>(this);
    uVar28 = (ulong)(uint)(pAVar27->values).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pAVar27->values).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar28);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case ArrayGetId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayGet,currp);
    pAVar23 = (ArraySet *)Expression::cast<wasm::ArrayGet>(this);
    goto LAB_0014b6a0;
  case ArraySetId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArraySet,currp);
    pAVar23 = Expression::cast<wasm::ArraySet>(this);
    goto LAB_0014b691;
  case ArrayLenId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayLen,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::ArrayLen>(this);
    goto LAB_0014b30a;
  case ArrayCopyId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayCopy,currp);
    pAVar23 = (ArraySet *)Expression::cast<wasm::ArrayCopy>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)
               &pAVar23[1].super_SpecificExpression<(wasm::Expression::Id)75>.super_Expression.type)
    ;
    goto LAB_0014b682;
  case ArrayFillId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayFill,currp);
    pAVar23 = (ArraySet *)Expression::cast<wasm::ArrayFill>(this);
LAB_0014b682:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pAVar23 + 1));
    goto LAB_0014b691;
  case ArrayInitDataId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayInitData,currp);
    pMVar11 = (MemoryInit *)Expression::cast<wasm::ArrayInitData>(this);
    goto LAB_0014ae09;
  case ArrayInitElemId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitArrayInitElem,currp);
    pMVar11 = (MemoryInit *)Expression::cast<wasm::ArrayInitElem>(this);
LAB_0014ae09:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)&pMVar11->memory);
LAB_0014b509:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,&pMVar11->size);
LAB_0014b518:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,&pMVar11->offset)
    ;
    pTVar30 = (TableGet *)&pMVar11->dest;
    goto LAB_0014b6b8;
  case RefAsId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitRefAs,currp);
    pRVar9 = Expression::cast<wasm::RefAs>(this);
    goto LAB_0014b4d1;
  case StringNewId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringNew,currp);
    pSVar26 = Expression::cast<wasm::StringNew>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::maybePushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               (TaskFunc)(pSVar26 + 0x28),currp_03);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::maybePushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               (TaskFunc)(pSVar26 + 0x20),currp_04);
    pTVar30 = (TableGet *)(pSVar26 + 0x18);
    goto LAB_0014b6b8;
  case StringConstId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringConst,currp);
    Expression::cast<wasm::StringConst>(this);
    return;
  case StringMeasureId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringMeasure,currp);
    pRVar9 = (RefAs *)Expression::cast<wasm::StringMeasure>(this);
LAB_0014b4d1:
    pTVar30 = (TableGet *)&pRVar9->value;
    goto LAB_0014b6b8;
  case StringEncodeId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringEncode,currp);
    pSVar5 = (StructSet *)Expression::cast<wasm::StringEncode>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::maybePushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               (TaskFunc)&pSVar5->order,currp_00);
    ppEVar4 = &pSVar5->value;
    goto LAB_0014b448;
  case StringConcatId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringConcat,currp);
    pAVar23 = (ArraySet *)Expression::cast<wasm::StringConcat>(this);
    goto LAB_0014b6a0;
  case StringEqId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringEq,currp);
    pSVar5 = (StructSet *)Expression::cast<wasm::StringEq>(this);
LAB_0014b43a:
    ppEVar4 = &pSVar5->value;
LAB_0014b448:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar4);
    pTVar30 = (TableGet *)&pSVar5->ref;
    goto LAB_0014b6b8;
  case StringWTF16GetId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringWTF16Get,currp);
    pAVar23 = (ArraySet *)Expression::cast<wasm::StringWTF16Get>(this);
    goto LAB_0014b6a0;
  case StringSliceWTFId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStringSliceWTF,currp);
    pAVar23 = (ArraySet *)Expression::cast<wasm::StringSliceWTF>(this);
LAB_0014b691:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,&pAVar23->value);
LAB_0014b6a0:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,&pAVar23->index);
    pTVar30 = (TableGet *)&pAVar23->ref;
    goto LAB_0014b6b8;
  case ContNewId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitContNew,currp);
    pRVar7 = (RefI31 *)Expression::cast<wasm::ContNew>(this);
LAB_0014b30a:
    pTVar30 = (TableGet *)&pRVar7->value;
LAB_0014b6b8:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)pTVar30);
    return;
  case ContBindId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitContBind,currp);
    pCVar6 = Expression::cast<wasm::ContBind>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pCVar6 + 0x30));
    uVar28 = (ulong)*(uint *)(pCVar6 + 0x18);
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pCVar6 + 0x10),uVar28);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case SuspendId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitSuspend,currp);
    pSVar20 = Expression::cast<wasm::Suspend>(this);
    uVar28 = (ulong)*(uint *)(pSVar20 + 0x28);
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pSVar20 + 0x20),uVar28);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case ResumeId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitResume,currp);
    pRVar2 = Expression::cast<wasm::Resume>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pRVar2 + 0x70));
    uVar28 = (ulong)*(uint *)(pRVar2 + 0x58);
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pRVar2 + 0x50),uVar28);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case ResumeThrowId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitResumeThrow,currp);
    pRVar24 = Expression::cast<wasm::ResumeThrow>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pRVar24 + 0x80));
    uVar28 = (ulong)*(uint *)(pRVar24 + 0x68);
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pRVar24 + 0x60),uVar28);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar4);
    }
    break;
  case StackSwitchId:
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,
               Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::doVisitStackSwitch,currp);
    pSVar3 = Expression::cast<wasm::StackSwitch>(this);
    Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
              ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,
               (Expression **)(pSVar3 + 0x40));
    uVar28 = (ulong)*(uint *)(pSVar3 + 0x28);
    while (0 < (int)uVar28) {
      uVar28 = uVar28 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (pSVar3 + 0x20),uVar28);
      Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)self,scan,ppEVar4);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }